

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::anon_unknown_23::OptionsToInterpret::OptionsToInterpret
          (OptionsToInterpret *this,string_view ns,string_view el,Span<const_int> path,
          Message *orig_opt,Message *opt)

{
  allocator<char> local_41;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  
  local_40._M_str = el._M_str;
  local_40._M_len = el._M_len;
  local_30._M_str = ns._M_str;
  local_30._M_len = ns._M_len;
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)this,&local_30,&local_41);
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&this->element_name,&local_40,&local_41);
  std::vector<int,std::allocator<int>>::vector<int_const*,void>
            ((vector<int,std::allocator<int>> *)&this->element_path,path.ptr_,path.ptr_ + path.len_,
             (allocator_type *)&local_41);
  this->original_options = orig_opt;
  this->options = opt;
  return;
}

Assistant:

OptionsToInterpret(absl::string_view ns, absl::string_view el,
                     absl::Span<const int> path, const Message* orig_opt,
                     Message* opt)
      : name_scope(ns),
        element_name(el),
        element_path(path.begin(), path.end()),
        original_options(orig_opt),
        options(opt) {}